

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_function_widget.cpp
# Opt level: O0

void __thiscall tfnw::TransferFunctionWidget::update_colormap(TransferFunctionWidget *this)

{
  float fVar1;
  reference pvVar2;
  size_type sVar3;
  pointer pvVar4;
  reference pvVar5;
  float fVar6;
  float fVar7;
  float local_54;
  float local_4c;
  float alpha;
  float t;
  __normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
  high;
  ulong uStack_28;
  float x;
  size_t i;
  size_t npixels;
  iterator a_it;
  TransferFunctionWidget *this_local;
  
  this->colormap_changed = true;
  this->gpu_image_stale = true;
  a_it._M_current = (vec2f *)this;
  pvVar2 = std::vector<tfnw::Colormap,_std::allocator<tfnw::Colormap>_>::operator[]
                     (&this->colormaps,this->selected_colormap);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->current_colormap,&pvVar2->colormap);
  npixels = (size_t)std::
                    vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>
                    ::begin(&this->alpha_control_pts);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->current_colormap);
  for (uStack_28 = 0; uStack_28 < sVar3 >> 2; uStack_28 = uStack_28 + 1) {
    local_4c = (float)uStack_28;
    local_54 = (float)(sVar3 >> 2);
    high._M_current._4_4_ = local_4c / local_54;
    _alpha = __gnu_cxx::
             __normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
             ::operator+((__normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
                          *)&npixels,1);
    fVar7 = high._M_current._4_4_;
    pvVar4 = __gnu_cxx::
             __normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
             ::operator->((__normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
                           *)&alpha);
    if (pvVar4->x <= fVar7 && fVar7 != pvVar4->x) {
      __gnu_cxx::
      __normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
      ::operator++((__normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
                    *)&npixels);
      __gnu_cxx::
      __normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
      ::operator++((__normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
                    *)&alpha);
    }
    fVar1 = high._M_current._4_4_;
    pvVar4 = __gnu_cxx::
             __normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
             ::operator->((__normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
                           *)&npixels);
    fVar7 = pvVar4->x;
    pvVar4 = __gnu_cxx::
             __normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
             ::operator->((__normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
                           *)&alpha);
    fVar6 = pvVar4->x;
    pvVar4 = __gnu_cxx::
             __normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
             ::operator->((__normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
                           *)&npixels);
    fVar6 = (fVar1 - fVar7) / (fVar6 - pvVar4->x);
    pvVar4 = __gnu_cxx::
             __normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
             ::operator->((__normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
                           *)&npixels);
    fVar7 = pvVar4->y;
    pvVar4 = __gnu_cxx::
             __normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
             ::operator->((__normal_iterator<tfnw::TransferFunctionWidget::vec2f_*,_std::vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>_>
                           *)&alpha);
    fVar7 = clamp<float>(((1.0 - fVar6) * fVar7 + fVar6 * pvVar4->y) * 255.0,0.0,255.0);
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->current_colormap,uStack_28 * 4 + 3);
    *pvVar5 = (value_type)(int)fVar7;
  }
  return;
}

Assistant:

void TransferFunctionWidget::update_colormap()
{
    colormap_changed = true;
    gpu_image_stale = true;
    current_colormap = colormaps[selected_colormap].colormap;
    // We only change opacities for now, so go through and update the opacity
    // by blending between the neighboring control points
    auto a_it = alpha_control_pts.begin();
    const size_t npixels = current_colormap.size() / 4;
    for (size_t i = 0; i < npixels; ++i) {
        float x = static_cast<float>(i) / npixels;
        auto high = a_it + 1;
        if (x > high->x) {
            ++a_it;
            ++high;
        }
        float t = (x - a_it->x) / (high->x - a_it->x);
        float alpha = (1.f - t) * a_it->y + t * high->y;
        current_colormap[i * 4 + 3] = static_cast<uint8_t>(clamp(alpha * 255.f, 0.f, 255.f));
    }
}